

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

void __thiscall
wasm::ABI::getStackSpace(ABI *this,Index local,Function *func,Index size,Module *wasm)

{
  Builder *ast;
  pointer puVar1;
  size_t sVar2;
  char *pcVar3;
  Expression **ppEVar4;
  undefined8 uVar5;
  pointer puVar6;
  pointer puVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Index IVar10;
  Global *pGVar11;
  Module *this_00;
  Expression *pEVar12;
  Const *pCVar13;
  Binary *pBVar14;
  LocalSet *pLVar15;
  GlobalSet *pGVar16;
  Expression *pEVar17;
  Block *this_01;
  undefined1 *puVar18;
  undefined1 auVar19 [8];
  Module *pMVar20;
  undefined4 in_register_0000000c;
  Expression **ppEVar21;
  MixedArena *this_02;
  undefined4 in_register_00000034;
  Builder *this_03;
  Index IVar22;
  ExpressionList *this_04;
  pointer *this_05;
  uint x;
  uintptr_t uVar23;
  Signature SVar24;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type;
  undefined1 local_240 [8];
  FindAllPointers<wasm::Return> finder;
  Builder local_38;
  Builder builder;
  
  this_03 = (Builder *)CONCAT44(in_register_00000034,local);
  pMVar20 = (Module *)CONCAT44(in_register_0000000c,size);
  IVar22 = (Index)this;
  pGVar11 = getStackPointerGlobal(pMVar20);
  if (pGVar11 == (Global *)0x0) {
    Fatal::Fatal((Fatal *)local_240);
    Fatal::operator<<((Fatal *)local_240,
                      (char (*) [48])"getStackSpace: failed to find the stack pointer");
    Fatal::~Fatal((Fatal *)local_240);
  }
  puVar1 = (pMVar20->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar1 == (pMVar20->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar23 = 2;
  }
  else {
    uVar23 = (((puVar1->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->addressType).id;
  }
  local_38.wasm = pMVar20;
  this_00 = (Module *)MixedArena::allocSpace(&pMVar20->allocator,0x40,8);
  *(Id *)&(this_00->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = BlockId;
  ((Type *)&(this_00->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->id = 0;
  (this_00->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&pMVar20->allocator;
  if (uVar23 != 2) {
    handle_unreachable("unhandled pointerType",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/abi/stack.h"
                       ,0x40);
  }
  x = (int)func + 0xfU & 0xfffffff0;
  sVar2 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_len;
  pcVar3 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_str;
  pEVar12 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
  pEVar12->_id = GlobalGetId;
  (pEVar12->type).id = 0;
  *(undefined8 *)(pEVar12 + 1) = 0;
  *(size_t *)(pEVar12 + 1) = sVar2;
  pEVar12[1].type.id = (uintptr_t)pcVar3;
  (pEVar12->type).id = 2;
  pCVar13 = Builder::makeConst<int>(&local_38,x);
  pBVar14 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  pBVar14->op = SubInt32;
  pBVar14->left = pEVar12;
  pBVar14->right = (Expression *)pCVar13;
  Binary::finalize(pBVar14);
  this_05 = &(this_00->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sVar2 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_len;
  pcVar3 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_str;
  pLVar15 = (LocalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
  (pLVar15->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id = LocalSetId;
  (pLVar15->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id = 0;
  pLVar15->index = IVar22;
  pLVar15->value = (Expression *)pBVar14;
  LocalSet::makeTee(pLVar15,(Type)0x2);
  pGVar16 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pGVar16->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId;
  (pGVar16->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
  (pGVar16->name).super_IString.str._M_len = 0;
  (pGVar16->name).super_IString.str._M_len = sVar2;
  (pGVar16->name).super_IString.str._M_str = pcVar3;
  pGVar16->value = (Expression *)pLVar15;
  GlobalSet::finalize(pGVar16);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_05,
             (Expression *)pGVar16);
  ast = this_03 + 0xc;
  FindAllPointers<wasm::Return>::FindAllPointers
            ((FindAllPointers<wasm::Return> *)local_240,(Expression **)ast);
  auVar19 = local_240;
  while( true ) {
    if (auVar19 ==
        (undefined1  [8])
        finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pMVar20 = ast->wasm;
      uVar23 = ((Type *)&(pMVar20->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->id;
      if (uVar23 == 0) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_05,
                   (Expression *)pMVar20);
        puVar6 = (pointer)(pGVar11->super_Importable).super_Named.name.super_IString.str._M_len;
        puVar7 = (pointer)(pGVar11->super_Importable).super_Named.name.super_IString.str._M_str;
        pEVar12 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar12->_id = LocalGetId;
        *(Index *)(pEVar12 + 1) = IVar22;
        (pEVar12->type).id = 2;
        pCVar13 = Builder::makeConst<int>(&local_38,x);
        pBVar14 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar14->op = AddInt32;
        pBVar14->left = pEVar12;
        pBVar14->right = (Expression *)pCVar13;
        Binary::finalize(pBVar14);
        pMVar20 = (Module *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        *(Id *)&(pMVar20->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = GlobalSetId;
        ((Type *)&(pMVar20->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->id = 0;
        (pMVar20->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pMVar20->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar6;
        (pMVar20->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = puVar7;
        (pMVar20->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)pBVar14;
        GlobalSet::finalize((GlobalSet *)pMVar20);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_05,
                   (Expression *)pMVar20);
      }
      else if (uVar23 == 1) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_05,
                   (Expression *)pMVar20);
      }
      else {
        SVar24 = HeapType::getSignature((HeapType *)(this_03 + 7));
        auVar9._8_8_ = 0;
        auVar9._0_8_ = SVar24.results.id.id;
        IVar10 = Builder::addVar(this_03,(Function *)0x0,(Name)(auVar9 << 0x40),(Type)wasm);
        pLVar15 = Builder::makeLocalSet(&local_38,IVar10,(Expression *)ast->wasm);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_05,
                   (Expression *)pLVar15);
        sVar2 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_len;
        pcVar3 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_str;
        pEVar12 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar12->_id = LocalGetId;
        *(Index *)(pEVar12 + 1) = IVar22;
        (pEVar12->type).id = 2;
        pCVar13 = Builder::makeConst<int>(&local_38,x);
        pBVar14 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
             BinaryId;
        (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
        pBVar14->op = AddInt32;
        pBVar14->left = pEVar12;
        pBVar14->right = (Expression *)pCVar13;
        Binary::finalize(pBVar14);
        pGVar16 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pGVar16->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
             GlobalSetId;
        (pGVar16->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
        (pGVar16->name).super_IString.str._M_len = 0;
        (pGVar16->name).super_IString.str._M_len = sVar2;
        (pGVar16->name).super_IString.str._M_str = pcVar3;
        pGVar16->value = (Expression *)pBVar14;
        GlobalSet::finalize(pGVar16);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_05,
                   (Expression *)pGVar16);
        SVar24 = HeapType::getSignature((HeapType *)(this_03 + 7));
        pMVar20 = (Module *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        *(Id *)&(pMVar20->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = LocalGetId;
        *(Index *)&(pMVar20->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage = IVar10;
        ((Type *)&(pMVar20->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->id = SVar24.results.id.id;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_05,
                   (Expression *)pMVar20);
      }
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pMVar20;
      Block::finalize((Block *)this_00,type__00,Unknown);
      ast->wasm = this_00;
      if (local_240 != (undefined1  [8])0x0) {
        operator_delete((void *)local_240,
                        (long)finder.list.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_240);
      }
      return;
    }
    ppEVar4 = *(Expression ***)auVar19;
    pEVar12 = *ppEVar4;
    if (pEVar12->_id != ReturnId) break;
    if ((*(long *)(pEVar12 + 1) == 0) || (*(long *)(*(long *)(pEVar12 + 1) + 8) == 1)) {
      sVar2 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar3 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_str;
      ppEVar21 = ppEVar4;
      pEVar17 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar17->_id = LocalGetId;
      *(Index *)(pEVar17 + 1) = IVar22;
      (pEVar17->type).id = 2;
      pCVar13 = Builder::makeConst<int>(&local_38,x);
      pBVar14 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar14->op = AddInt32;
      pBVar14->left = pEVar17;
      pBVar14->right = (Expression *)pCVar13;
      Binary::finalize(pBVar14);
      pGVar16 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pGVar16->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (pGVar16->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (pGVar16->name).super_IString.str._M_len = 0;
      (pGVar16->name).super_IString.str._M_len = sVar2;
      (pGVar16->name).super_IString.str._M_str = pcVar3;
      pGVar16->value = (Expression *)pBVar14;
      GlobalSet::finalize(pGVar16);
      wasm = (Module *)0x0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)ppEVar21;
      this_01 = Builder::makeSequence(&local_38,(Expression *)pGVar16,pEVar12,type);
    }
    else {
      this_02 = &(local_38.wasm)->allocator;
      this_01 = (Block *)MixedArena::allocSpace(this_02,0x40,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_01->name).super_IString.str._M_len = 0;
      (this_01->name).super_IString.str._M_str = (char *)0x0;
      (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (this_01->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (this_01->list).allocator = this_02;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(*(long *)(pEVar12 + 1) + 8);
      IVar10 = Builder::addVar(this_03,(Function *)0x0,(Name)(auVar8 << 0x40),(Type)wasm);
      pLVar15 = Builder::makeLocalSet(&local_38,IVar10,*(Expression **)(pEVar12 + 1));
      this_04 = &this_01->list;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_04->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar15);
      sVar2 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar3 = (pGVar11->super_Importable).super_Named.name.super_IString.str._M_str;
      pEVar17 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar17->_id = LocalGetId;
      *(Index *)(pEVar17 + 1) = IVar22;
      (pEVar17->type).id = 2;
      pCVar13 = Builder::makeConst<int>(&local_38,x);
      pBVar14 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
      (pBVar14->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
      pBVar14->op = AddInt32;
      pBVar14->left = pEVar17;
      pBVar14->right = (Expression *)pCVar13;
      Binary::finalize(pBVar14);
      pGVar16 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pGVar16->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (pGVar16->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (pGVar16->name).super_IString.str._M_len = 0;
      (pGVar16->name).super_IString.str._M_len = sVar2;
      (pGVar16->name).super_IString.str._M_str = pcVar3;
      pGVar16->value = (Expression *)pBVar14;
      GlobalSet::finalize(pGVar16);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_04->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar16);
      uVar5 = *(undefined8 *)(*(long *)(pEVar12 + 1) + 8);
      puVar18 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      *puVar18 = 8;
      *(Index *)(puVar18 + 0x10) = IVar10;
      *(undefined8 *)(puVar18 + 8) = uVar5;
      pEVar12 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar12->_id = ReturnId;
      (pEVar12->type).id = 0;
      *(undefined8 *)(pEVar12 + 1) = 0;
      (pEVar12->type).id = 1;
      *(undefined1 **)(pEVar12 + 1) = puVar18;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_04->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar12
                );
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar12;
      Block::finalize(this_01,type_,Unknown);
    }
    *ppEVar4 = (Expression *)this_01;
    auVar19 = (undefined1  [8])((long)auVar19 + 8);
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::Return]");
}

Assistant:

inline void
getStackSpace(Index local, Function* func, Index size, Module& wasm) {
  auto* stackPointer = getStackPointerGlobal(wasm);
  if (!stackPointer) {
    Fatal() << "getStackSpace: failed to find the stack pointer";
  }
  // align the size
  size = stackAlign(size);
  auto pointerType =
    !wasm.memories.empty() ? wasm.memories[0]->addressType : Type::i32;
  // TODO: find existing stack usage, and add on top of that - carefully
  Builder builder(wasm);
  auto* block = builder.makeBlock();
  // TODO: add stack max check
  Expression* added;
  if (pointerType == Type::i32) {
    // The stack goes downward in the LLVM wasm backend.
    added =
      builder.makeBinary(SubInt32,
                         builder.makeGlobalGet(stackPointer->name, pointerType),
                         builder.makeConst(int32_t(size)));
  } else {
    WASM_UNREACHABLE("unhandled pointerType");
  }
  block->list.push_back(builder.makeGlobalSet(
    stackPointer->name, builder.makeLocalTee(local, added, pointerType)));
  auto makeStackRestore = [&]() {
    return builder.makeGlobalSet(
      stackPointer->name,
      builder.makeBinary(AddInt32,
                         builder.makeLocalGet(local, pointerType),
                         builder.makeConst(int32_t(size))));
  };
  // add stack restores to the returns
  FindAllPointers<Return> finder(func->body);
  for (auto** ptr : finder.list) {
    auto* ret = (*ptr)->cast<Return>();
    if (ret->value && ret->value->type != Type::unreachable) {
      // handle the returned value
      auto* block = builder.makeBlock();
      auto temp = builder.addVar(func, ret->value->type);
      block->list.push_back(builder.makeLocalSet(temp, ret->value));
      block->list.push_back(makeStackRestore());
      block->list.push_back(
        builder.makeReturn(builder.makeLocalGet(temp, ret->value->type)));
      block->finalize();
      *ptr = block;
    } else {
      // restore, then return
      *ptr = builder.makeSequence(makeStackRestore(), ret);
    }
  }
  // add stack restores to the body
  if (func->body->type == Type::none) {
    block->list.push_back(func->body);
    block->list.push_back(makeStackRestore());
  } else if (func->body->type == Type::unreachable) {
    block->list.push_back(func->body);
    // no need to restore the old stack value, we're gone anyhow
  } else {
    // save the return value
    auto temp = builder.addVar(func, func->getResults());
    block->list.push_back(builder.makeLocalSet(temp, func->body));
    block->list.push_back(makeStackRestore());
    block->list.push_back(builder.makeLocalGet(temp, func->getResults()));
  }
  block->finalize();
  func->body = block;
}